

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O0

QMimeData * __thiscall QTextEditControl::createMimeDataFromSelection(QTextEditControl *this)

{
  QTextEdit *pQVar1;
  QWidgetTextControl *in_RDI;
  QTextEdit *ed;
  QMimeData *local_8;
  
  QObject::parent((QObject *)0x6d949c);
  pQVar1 = qobject_cast<QTextEdit*>((QObject *)0x6d94a4);
  if (pQVar1 == (QTextEdit *)0x0) {
    local_8 = QWidgetTextControl::createMimeDataFromSelection(in_RDI);
  }
  else {
    local_8 = (QMimeData *)
              (**(code **)(*(long *)&(pQVar1->super_QAbstractScrollArea).super_QFrame.super_QWidget
                          + 0x1d0))();
  }
  return local_8;
}

Assistant:

virtual QMimeData *createMimeDataFromSelection() const override {
        QTextEdit *ed = qobject_cast<QTextEdit *>(parent());
        if (!ed)
            return QWidgetTextControl::createMimeDataFromSelection();
        return ed->createMimeDataFromSelection();
    }